

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O0

void __thiscall rcg::ImageList::add(ImageList *this,Buffer *buffer,uint32_t part)

{
  const_iterator __position;
  size_type sVar1;
  ulong *in_RDI;
  uint32_t in_stack_000000c4;
  Buffer *in_stack_000000c8;
  Image *in_stack_000000d0;
  Image *in_stack_ffffffffffffff88;
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  *this_00;
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  *this_01;
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  *this_02;
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  local_28;
  
  this_02 = (vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
             *)(in_RDI + 1);
  __position._M_current = (shared_ptr<const_rcg::Image> *)operator_new(0x58);
  Image::Image(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
  this_01 = &local_28;
  std::shared_ptr<rcg::Image_const>::shared_ptr<rcg::Image,void>
            ((shared_ptr<const_rcg::Image> *)this_01,in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
  push_back(this_01,(value_type *)in_stack_ffffffffffffff88);
  std::shared_ptr<const_rcg::Image>::~shared_ptr((shared_ptr<const_rcg::Image> *)0x137429);
  while( true ) {
    sVar1 = std::
            vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
            ::size((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                    *)(in_RDI + 1));
    if (sVar1 <= *in_RDI) break;
    this_00 = (vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
               *)(in_RDI + 1);
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    begin(this_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<rcg::Image_const>const*,std::vector<std::shared_ptr<rcg::Image_const>,std::allocator<std::shared_ptr<rcg::Image_const>>>>
    ::__normal_iterator<std::shared_ptr<rcg::Image_const>*>
              ((__normal_iterator<const_std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
                *)this_01,
               (__normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
                *)this_00);
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    erase(this_02,__position);
  }
  return;
}

Assistant:

void ImageList::add(const Buffer *buffer, uint32_t part)
{
  list.push_back(std::shared_ptr<const Image>(new Image(buffer, part)));

  while (list.size() > maxsize)
  {
    list.erase(list.begin());
  }
}